

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsing-utils.c
# Opt level: O0

_Bool str_to_int32(char *string,int32_t *out)

{
  int iVar1;
  int *piVar2;
  long lVar3;
  bool bVar4;
  bool bVar5;
  _Bool result;
  _Bool failed;
  _Bool out_of_range;
  long conv_ret_val;
  char *endptr;
  _Bool is_negated;
  ulong uStack_20;
  int base;
  size_t len;
  int32_t *out_local;
  char *string_local;
  
  len = (size_t)out;
  out_local = (int32_t *)string;
  uStack_20 = strlen(string);
  endptr._4_4_ = 10;
  endptr._3_1_ = false;
  if ((uStack_20 != 0) && (((char)*out_local == '-' || ((char)*out_local == '+')))) {
    endptr._3_1_ = (char)*out_local == '-';
    uStack_20 = uStack_20 - 1;
    out_local = (int32_t *)((long)out_local + 1);
  }
  if (((uStack_20 < 2) || ((char)*out_local != '0')) || (*(char *)((long)out_local + 1) != 'x')) {
    if (((1 < uStack_20) && ((char)*out_local == '0')) && (*(char *)((long)out_local + 1) == 'b')) {
      endptr._4_4_ = 2;
      out_local = (int32_t *)((long)out_local + 2);
      uStack_20 = uStack_20 - 2;
    }
  }
  else {
    endptr._4_4_ = 0x10;
    out_local = (int32_t *)((long)out_local + 2);
    uStack_20 = uStack_20 - 2;
  }
  conv_ret_val = 0;
  piVar2 = __errno_location();
  *piVar2 = 0;
  lVar3 = strtol((char *)out_local,(char **)&conv_ret_val,endptr._4_4_);
  iVar1 = 1;
  if ((endptr._3_1_ & 1) != 0) {
    iVar1 = -1;
  }
  lVar3 = iVar1 * lVar3;
  piVar2 = __errno_location();
  bVar5 = true;
  if ((*piVar2 != 0x22) && (bVar5 = true, -0x80000001 < lVar3)) {
    bVar5 = 0x7fffffff < lVar3;
  }
  bVar4 = true;
  if (((uStack_20 != 0) && (bVar4 = true, !bVar5)) &&
     (bVar4 = true, (int32_t *)conv_ret_val != out_local)) {
    bVar4 = conv_ret_val == 0;
  }
  bVar5 = false;
  if (!bVar4) {
    bVar5 = *(char *)conv_ret_val == '\0';
  }
  if (bVar5) {
    *(int *)len = (int)lVar3;
  }
  else {
    *(undefined4 *)len = 0x80000000;
  }
  return bVar5;
}

Assistant:

bool str_to_int32(const char *string, int32_t *out) {
    size_t len = strlen(string);
    int base = 10;

    bool is_negated = false;
    if (len >= 1 && (string[0] == '-' || string[0] == '+')) {
        is_negated = string[0] == '-';

        len -= 1;
        string += 1;
    }

    if (len >= 2 && string[0] == '0' && string[1] == 'x') {
        base = 16;
        string += 2;
        len -= 2;
    } else if (len >= 2 && string[0] == '0' && string[1] == 'b') {
        base = 2;
        string += 2;
        len -= 2;
    }

    STATIC_ASSERT(sizeof(long) >= sizeof(int32_t),
                  "These sizes should match so that we can use the correct "
                  "strtoXXX C function");

    char *endptr = NULL;
    errno = 0;
    long conv_ret_val = strtol(string, &endptr, base);
    conv_ret_val *= is_negated ? -1 : +1;

    bool out_of_range = (errno == ERANGE) || (conv_ret_val < INT32_MIN) ||
                        (conv_ret_val > INT32_MAX);

    bool failed =
        len == 0 || out_of_range || endptr == string || endptr == NULL;
    bool result = !failed && *endptr == '\0';

    if (result) {
        *out = conv_ret_val;
    } else {
        *out = INT32_MIN;
    }

    return result;
}